

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QDockAreaLayoutInfo::unplug(QDockAreaLayoutInfo *this,QList<int> *path)

{
  int index;
  ulong uVar1;
  QDockAreaLayoutInfo *this_00;
  int *piVar2;
  int iVar3;
  int iVar4;
  pointer pQVar5;
  QLayoutItem *pQVar6;
  pointer pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (path->d).size;
  index = *(path->d).ptr;
  pQVar5 = QList<QDockAreaLayoutItem>::data(&this->item_list);
  if (uVar1 < 2) {
    pQVar7 = pQVar5 + index;
    iVar3 = prev(this,index);
    iVar4 = next(this,index);
    *(byte *)&pQVar5[index].flags = (byte)pQVar5[index].flags | 1;
    if (this->tabbed == false) {
      if ((iVar3 != -1) && (((this->item_list).d.ptr[iVar3].flags & 1) == 0)) {
        piVar2 = this->sep;
        pQVar7->pos = pQVar7->pos - *piVar2;
        pQVar7->size = pQVar7->size + *piVar2;
      }
      if ((iVar4 != -1) && (((this->item_list).d.ptr[iVar4].flags & 1) == 0)) {
        pQVar7->size = pQVar7->size + *this->sep;
      }
    }
    pQVar6 = pQVar7->widgetItem;
  }
  else {
    this_00 = pQVar5[index].subinfo;
    QList<int>::mid((QList<int> *)&local_50,path,1,-1);
    pQVar6 = unplug(this_00,(QList<int> *)&local_50);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QDockAreaLayoutInfo::unplug(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());

    const int index = path.first();
    if (path.size() > 1) {
        QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        return item.subinfo->unplug(path.mid(1));
    }

    QDockAreaLayoutItem &item = item_list[index];
    int prev = this->prev(index);
    int next = this->next(index);

    Q_ASSERT(!(item.flags & QDockAreaLayoutItem::GapItem));
    item.flags |= QDockAreaLayoutItem::GapItem;

#if QT_CONFIG(tabbar)
    if (tabbed) {
    } else
#endif
    {
        if (prev != -1 && !(item_list.at(prev).flags & QDockAreaLayoutItem::GapItem)) {
            item.pos -= *sep;
            item.size += *sep;
        }
        if (next != -1 && !(item_list.at(next).flags & QDockAreaLayoutItem::GapItem))
            item.size += *sep;
    }

    return item.widgetItem;
}